

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

void * jx9StreamOpenHandle(jx9_vm *pVm,jx9_io_stream *pStream,char *zFile,int iFlags,int use_include
                          ,jx9_value *pResource,int bPushInclude,int *pNew)

{
  char cVar1;
  uint uVar2;
  sxu32 sVar3;
  char *pcVar4;
  sxi32 sVar5;
  int iVar6;
  char *pcVar7;
  SyString sFile;
  void *local_80;
  int local_78;
  int local_74;
  SyBlob local_70;
  char *local_50;
  uint local_48;
  jx9_value *local_40;
  jx9_io_stream *local_38;
  
  local_80 = (void *)0x0;
  if (pStream == (jx9_io_stream *)0x0) {
    return (void *)0x0;
  }
  cVar1 = *zFile;
  local_50 = zFile;
  if (cVar1 == '\0') {
    local_48 = 0;
    if (use_include != 0) {
LAB_0012d3dc:
      local_70.pBlob = (char *)0x0;
      local_70.nByte = 0;
      local_70.mByte = 0;
      local_70.nFlags = 0;
      (pVm->aPaths).nCursor = 0;
      local_78 = -2;
      local_74 = iFlags;
      local_70.pAllocator = &pVm->sAllocator;
      local_40 = pResource;
      local_38 = pStream;
      while (uVar2 = (pVm->aPaths).nCursor, uVar2 < (pVm->aPaths).nUsed) {
        (pVm->aPaths).nCursor = uVar2 + 1;
        SyBlobFormat(&local_70,"%z%c%z",
                     (ulong)((pVm->aPaths).eSize * uVar2) + (long)(pVm->aPaths).pBase,0x2f,&local_50
                    );
        sVar3 = local_70.nByte;
        sVar5 = SyBlobAppend(&local_70,"",1);
        if (sVar5 == 0) {
          local_70._16_8_ = CONCAT44(local_70.mByte,sVar3);
          iVar6 = (*local_38->xOpen)((char *)local_70.pBlob,local_74,local_40,&local_80);
          if (iVar6 == 0) {
            if (bPushInclude == 0) {
              iVar6 = 0;
            }
            else {
              jx9VmPushFilePath(pVm,(char *)local_70.pBlob,local_70.nByte,'\0',pNew);
              iVar6 = 0;
            }
            goto LAB_0012d4f5;
          }
          local_70._16_8_ = local_70._16_8_ & 0xffffffff00000000;
          local_78 = iVar6;
          if ((local_70.nFlags & 4) != 0) {
            local_70.pBlob = (char *)0x0;
            local_70.nByte = 0;
            local_70.mByte = 0;
            local_70.nFlags = local_70.nFlags & 0xfffffffb;
          }
        }
      }
      (pVm->aPaths).nCursor = 0;
      iVar6 = local_78;
LAB_0012d4f5:
      if (((local_70.nFlags & 6) == 0) && (local_70.mByte != 0)) {
        SyMemBackendFree(local_70.pAllocator,local_70.pBlob);
      }
      goto LAB_0012d540;
    }
  }
  else {
    pcVar4 = zFile + 2;
    do {
      pcVar7 = pcVar4;
      if (pcVar7[-1] == '\0') {
        pcVar7 = pcVar7 + -1;
        goto LAB_0012d51c;
      }
      if (*pcVar7 == '\0') goto LAB_0012d51c;
      if (pcVar7[1] == '\0') {
        pcVar7 = pcVar7 + 1;
        goto LAB_0012d51c;
      }
      pcVar4 = pcVar7 + 4;
    } while (pcVar7[2] != '\0');
    pcVar7 = pcVar7 + 2;
LAB_0012d51c:
    local_48 = (int)pcVar7 - (int)zFile;
    if (use_include != 0) {
      if (((cVar1 != '/') && (((cVar1 != '.' || (local_48 < 2)) || (zFile[1] != '/')))) &&
         ((((cVar1 != '.' || (local_48 < 3)) || (zFile[1] != '.')) || (zFile[2] != '/'))))
      goto LAB_0012d3dc;
      iVar6 = (*pStream->xOpen)(zFile,iFlags,pResource,&local_80);
LAB_0012d540:
      if ((bPushInclude != 0) && (iVar6 == 0)) {
        jx9VmPushFilePath(pVm,local_50,local_48,'\0',pNew);
        return local_80;
      }
      goto LAB_0012d576;
    }
  }
  iVar6 = (*pStream->xOpen)(zFile,iFlags,pResource,&local_80);
LAB_0012d576:
  if (iVar6 != 0) {
    return (void *)0x0;
  }
  return local_80;
}

Assistant:

JX9_PRIVATE void * jx9StreamOpenHandle(jx9_vm *pVm, const jx9_io_stream *pStream, const char *zFile, 
	int iFlags, int use_include, jx9_value *pResource, int bPushInclude, int *pNew)
{
	void *pHandle = 0; /* cc warning */
	SyString sFile;
	int rc;
	if( pStream == 0 ){
		/* No such stream device */
		return 0;
	}
	SyStringInitFromBuf(&sFile, zFile, SyStrlen(zFile));
	if( use_include ){
		if(	sFile.zString[0] == '/' ||
#ifdef __WINNT__
			(sFile.nByte > 2 && sFile.zString[1] == ':' && (sFile.zString[2] == '\\' || sFile.zString[2] == '/') ) ||
#endif
			(sFile.nByte > 1 && sFile.zString[0] == '.' && sFile.zString[1] == '/') ||
			(sFile.nByte > 2 && sFile.zString[0] == '.' && sFile.zString[1] == '.' && sFile.zString[2] == '/') ){
				/*  Open the file directly */
				rc = pStream->xOpen(zFile, iFlags, pResource, &pHandle);
		}else{
			SyString *pPath;
			SyBlob sWorker;
#ifdef __WINNT__
			static const int c = '\\';
#else
			static const int c = '/';
#endif
			/* Init the path builder working buffer */
			SyBlobInit(&sWorker, &pVm->sAllocator);
			/* Build a path from the set of include path */
			SySetResetCursor(&pVm->aPaths);
			rc = SXERR_IO;
			while( SXRET_OK == SySetGetNextEntry(&pVm->aPaths, (void **)&pPath) ){
				/* Build full path */
				SyBlobFormat(&sWorker, "%z%c%z", pPath, c, &sFile);
				/* Append null terminator */
				if( SXRET_OK != SyBlobNullAppend(&sWorker) ){
					continue;
				}
				/* Try to open the file */
				rc = pStream->xOpen((const char *)SyBlobData(&sWorker), iFlags, pResource, &pHandle);
				if( rc == JX9_OK ){
					if( bPushInclude ){
						/* Mark as included */
						jx9VmPushFilePath(pVm, (const char *)SyBlobData(&sWorker), SyBlobLength(&sWorker), FALSE, pNew);
					}
					break;
				}
				/* Reset the working buffer */
				SyBlobReset(&sWorker);
				/* Check the next path */
			}
			SyBlobRelease(&sWorker);
		}
		if( rc == JX9_OK ){
			if( bPushInclude ){
				/* Mark as included */
				jx9VmPushFilePath(pVm, sFile.zString, sFile.nByte, FALSE, pNew);
			}
		}
	}else{
		/* Open the URI direcly */
		rc = pStream->xOpen(zFile, iFlags, pResource, &pHandle);
	}
	if( rc != JX9_OK ){
		/* IO error */
		return 0;
	}
	/* Return the file handle */
	return pHandle;
}